

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rephase.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::rephase(Internal *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long count;
  uint uVar4;
  long lVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  
  lVar5 = (this->stats).rephased.total + 1;
  (this->stats).rephased.total = lVar5;
  if (this->internal != (Internal *)0x0) {
    phase(this->internal,"rephase",lVar5,"reached rephase limit %ld after %ld conflicts",
          (this->lim).rephase,(this->stats).conflicts);
  }
  report(this,'~',1);
  backtrack(this,0);
  clear_phases(this,&(this->phases).target);
  this->target_assigned = 0;
  bVar1 = this->stable;
  uVar3 = (this->lim).rephased[bVar1];
  (this->lim).rephased[bVar1] = uVar3 + 1;
  bVar7 = (this->opts).stabilize == 0;
  iVar2 = (this->opts).walk;
  bVar8 = (this->opts).stabilizeonly != 0;
  uVar4 = (uint)uVar3;
  if (iVar2 == 0 && (bVar8 || bVar7)) {
    switch(uVar4 & 7) {
    case 0:
      goto switchD_00680312_caseD_0;
    default:
switchD_00680312_caseD_1:
      rephase_best(this);
      cVar6 = 'B';
      goto LAB_0068044a;
    case 2:
switchD_00680312_caseD_2:
      rephase_flipping(this);
      cVar6 = 'F';
      goto LAB_0068044a;
    case 4:
switchD_00680312_caseD_4:
      rephase_random(this);
      cVar6 = '#';
      goto LAB_0068044a;
    case 6:
      goto switchD_00680312_caseD_6;
    }
  }
  if ((bVar8 || bVar7) && iVar2 != 0) {
    (*(code *)(&DAT_0076e6d0 + *(int *)(&DAT_0076e6d0 + (uVar3 % 0xc) * 4)))();
    return;
  }
  if ((iVar2 == 0 & bVar1) == 1) {
    if (uVar3 != 1) {
      if (uVar3 != 0) {
        switch(uVar4 & 3) {
        default:
          goto switchD_00680312_caseD_1;
        case 1:
          goto switchD_00680312_caseD_0;
        case 3:
          break;
        }
      }
switchD_00680312_caseD_6:
      rephase_original(this);
      cVar6 = 'O';
      goto LAB_0068044a;
    }
  }
  else {
    if (bVar1 != true || iVar2 == 0) {
      if ((bVar1 == false) && ((iVar2 == 0 || ((this->opts).walknonstable == 0)))) {
        if (uVar3 != 0) {
          switch(uVar4 - 1 & 3) {
          case 0:
            goto switchD_00680312_caseD_4;
          default:
            goto switchD_00680312_caseD_1;
          case 2:
            break;
          }
        }
      }
      else if (uVar3 != 0) {
        (*(code *)(&DAT_0076e728 + *(int *)(&DAT_0076e728 + ((uVar3 - 1) % 6) * 4)))();
        return;
      }
      goto switchD_00680312_caseD_2;
    }
    if (uVar3 != 1) {
      if (uVar3 != 0) {
        (*(code *)(&DAT_0076e700 + *(int *)(&DAT_0076e700 + ((uVar3 - 2) % 6) * 4)))();
        return;
      }
      goto switchD_00680312_caseD_6;
    }
  }
switchD_00680312_caseD_0:
  rephase_inverted(this);
  cVar6 = 'I';
LAB_0068044a:
  lVar5 = (this->stats).conflicts;
  count = (this->stats).rephased.total;
  (this->lim).rephase = (count + 1) * (long)(this->opts).rephaseint + lVar5;
  if (this->internal != (Internal *)0x0) {
    phase(this->internal,"rephase",count,"new rephase limit %ld after %ld conflicts");
    lVar5 = (this->stats).conflicts;
  }
  (this->last).rephase.conflicts = lVar5;
  this->rephased = cVar6;
  if (this->stable == true) {
    shuffle_scores(this);
    return;
  }
  shuffle_queue(this);
  return;
}

Assistant:

void Internal::rephase () {

  stats.rephased.total++;
  PHASE ("rephase", stats.rephased.total,
         "reached rephase limit %" PRId64 " after %" PRId64 " conflicts",
         lim.rephase, stats.conflicts);

  // Report current 'target' and 'best' and then set 'rephased' below, which
  // will trigger reporting the new 'target' and 'best' after updating it in
  // the next 'update_target_and_best' called from the next 'backtrack'.
  //
  report ('~', 1);

  backtrack ();
  clear_phases (phases.target);
  target_assigned = 0;

  size_t count = lim.rephased[stable]++;
  bool single;
  char type;

  if (opts.stabilize && opts.stabilizeonly)
    single = true;
  else
    single = !opts.stabilize;

  if (single && !opts.walk) {
    // (inverted,best,flipping,best,random,best,original,best)^\omega
    switch (count % 8) {
    case 0:
      type = rephase_inverted ();
      break;
    case 1:
      type = rephase_best ();
      break;
    case 2:
      type = rephase_flipping ();
      break;
    case 3:
      type = rephase_best ();
      break;
    case 4:
      type = rephase_random ();
      break;
    case 5:
      type = rephase_best ();
      break;
    case 6:
      type = rephase_original ();
      break;
    case 7:
      type = rephase_best ();
      break;
    default:
      type = 0;
      break;
    }
  } else if (single && opts.walk) {
    // (inverted,best,walk,
    //  flipping,best,walk,
    //    random,best,walk,
    //  original,best,walk)^\omega
    switch (count % 12) {
    case 0:
      type = rephase_inverted ();
      break;
    case 1:
      type = rephase_best ();
      break;
    case 2:
      type = rephase_walk ();
      break;
    case 3:
      type = rephase_flipping ();
      break;
    case 4:
      type = rephase_best ();
      break;
    case 5:
      type = rephase_walk ();
      break;
    case 6:
      type = rephase_random ();
      break;
    case 7:
      type = rephase_best ();
      break;
    case 8:
      type = rephase_walk ();
      break;
    case 9:
      type = rephase_original ();
      break;
    case 10:
      type = rephase_best ();
      break;
    case 11:
      type = rephase_walk ();
      break;
    default:
      type = 0;
      break;
    }
  } else if (stable && !opts.walk) {
    // original,inverted,(best,original,best,inverted)^\omega
    if (!count)
      type = rephase_original ();
    else if (count == 1)
      type = rephase_inverted ();
    else
      switch ((count - 2) % 4) {
      case 0:
        type = rephase_best ();
        break;
      case 1:
        type = rephase_original ();
        break;
      case 2:
        type = rephase_best ();
        break;
      case 3:
        type = rephase_inverted ();
        break;
      default:
        type = 0;
        break;
      }
  } else if (stable && opts.walk) {
    // original,inverted,(best,walk,original,best,walk,inverted)^\omega
    if (!count)
      type = rephase_original ();
    else if (count == 1)
      type = rephase_inverted ();
    else
      switch ((count - 2) % 6) {
      case 0:
        type = rephase_best ();
        break;
      case 1:
        type = rephase_walk ();
        break;
      case 2:
        type = rephase_original ();
        break;
      case 3:
        type = rephase_best ();
        break;
      case 4:
        type = rephase_walk ();
        break;
      case 5:
        type = rephase_inverted ();
        break;
      default:
        type = 0;
        break;
      }
  } else if (!stable && (!opts.walk || !opts.walknonstable)) {
    // flipping,(random,best,flipping,best)^\omega
    if (!count)
      type = rephase_flipping ();
    else
      switch ((count - 1) % 4) {
      case 0:
        type = rephase_random ();
        break;
      case 1:
        type = rephase_best ();
        break;
      case 2:
        type = rephase_flipping ();
        break;
      case 3:
        type = rephase_best ();
        break;
      default:
        type = 0;
        break;
      }
  } else {
    assert (!stable && opts.walk && opts.walknonstable);
    // flipping,(random,best,walk,flipping,best,walk)^\omega
    if (!count)
      type = rephase_flipping ();
    else
      switch ((count - 1) % 6) {
      case 0:
        type = rephase_random ();
        break;
      case 1:
        type = rephase_best ();
        break;
      case 2:
        type = rephase_walk ();
        break;
      case 3:
        type = rephase_flipping ();
        break;
      case 4:
        type = rephase_best ();
        break;
      case 5:
        type = rephase_walk ();
        break;
      default:
        type = 0;
        break;
      }
  }
  assert (type);

  int64_t delta = opts.rephaseint * (stats.rephased.total + 1);
  lim.rephase = stats.conflicts + delta;

  PHASE ("rephase", stats.rephased.total,
         "new rephase limit %" PRId64 " after %" PRId64 " conflicts",
         lim.rephase, delta);

  // This will trigger to report the effect of this new set of phases at the
  // 'backtrack' (actually 'update_target_and_best') after the next
  // conflict, as well as resetting 'best_assigned' then to allow to compute
  // a new "best" assignment at that point.
  //
  last.rephase.conflicts = stats.conflicts;
  rephased = type;

  if (stable)
    shuffle_scores ();
  else
    shuffle_queue ();
}